

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

bool __thiscall Image::is_approximately_equal_to(Image *this,Image *other)

{
  int iVar1;
  int iVar2;
  Pixel PVar3;
  ostream *poVar4;
  void *pvVar5;
  long in_RSI;
  double in_RDI;
  __type _Var6;
  double dVar7;
  double channel_err;
  int c_1;
  int total_pixels;
  double that_val;
  double this_val;
  int c;
  int x;
  int y;
  double err [4];
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint local_6c;
  uchar local_64 [4];
  double local_60;
  uchar local_54 [4];
  double local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  double local_38 [6];
  bool local_1;
  
  if ((*(int *)((long)in_RDI + 0x20) == *(int *)(in_RSI + 0x20)) &&
     (*(int *)((long)in_RDI + 0x24) == *(int *)(in_RSI + 0x24))) {
    memset(local_38,0,0x20);
    for (local_3c = 0; local_3c < *(uint *)((long)in_RDI + 0x24); local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < *(uint *)((long)in_RDI + 0x20); local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < *(uint *)((long)in_RDI + 0x28); local_44 = local_44 + 1) {
          PVar3 = pixel((Image *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                        0x11a9ea);
          local_54[0] = PVar3.colors[0];
          local_54[1] = PVar3.colors[1];
          local_54[2] = PVar3.colors[2];
          local_54[3] = PVar3.colors[3];
          local_50 = (double)local_54[(int)local_44];
          PVar3 = pixel((Image *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0,
                        0x11aa14);
          local_64[0] = PVar3.colors[0];
          local_64[1] = PVar3.colors[1];
          local_64[2] = PVar3.colors[2];
          local_64[3] = PVar3.colors[3];
          local_60 = (double)local_64[(int)local_44];
          _Var6 = std::pow<double,int>(in_RDI,in_stack_ffffffffffffff7c);
          local_38[(int)local_44] = SQRT(_Var6) + local_38[(int)local_44];
        }
      }
    }
    iVar1 = *(int *)((long)in_RDI + 0x20);
    iVar2 = *(int *)((long)in_RDI + 0x24);
    for (local_6c = 0; local_6c < *(uint *)((long)in_RDI + 0x28); local_6c = local_6c + 1) {
      dVar7 = local_38[(int)local_6c] / (double)(iVar1 * iVar2);
      if (*(double *)((long)in_RDI + 0x30) <= dVar7 && dVar7 != *(double *)((long)in_RDI + 0x30)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Channel ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
        poVar4 = std::operator<<(poVar4," error threshold (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(double *)((long)in_RDI + 0x30));
        poVar4 = std::operator<<(poVar4,") exceeded.");
        poVar4 = std::operator<<(poVar4,"Average pixel error: ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar7);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        return false;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Channel ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c);
      poVar4 = std::operator<<(poVar4," average pixel error: ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar7);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    local_1 = true;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Not approximately equal because dimensions are different.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Image::is_approximately_equal_to(const Image *other) const {
  if ((width != other->width) || (height != other->height)) {
    std::cerr << "Not approximately equal because dimensions are different." << std::endl;
    return false;
  }

  // Calculate the error on each channel
  double err[4] = {0.0};
  for (int y = 0; y < height; y++) {
    for (int x = 0; x < width; x++) {
      for (int c = 0; c < colors; c++) {
        auto this_val = (double) pixel(x, y).colors[c];
        auto that_val = (double) other->pixel(x, y).colors[c];

        err[c] += std::sqrt(std::pow(this_val - that_val, 2));
      }
    }
  }

  int total_pixels = width * height;

  for (int c = 0; c < colors; c++) {
    auto channel_err = err[c] / total_pixels;
    if (channel_err > error_threshold) {
      std::cerr << "Channel " << c << " error threshold (" << error_threshold << ") exceeded."
                << "Average pixel error: " << channel_err << std::endl;
      return false;
    } else {
      std::cout << "Channel " << c << " average pixel error: " << channel_err << std::endl;
    }
  }
  return true;
}